

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmqBrokerServer.cpp
# Opt level: O1

string * __thiscall
helics::apps::zmqBrokerServer::generateResponseToMessage_abi_cxx11_
          (string *__return_storage_ptr__,zmqBrokerServer *this,message_t *msg,portData *pdata,
          CoreType ctype)

{
  pointer pcVar1;
  pointer pcVar2;
  undefined8 uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  void *data;
  size_t size;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  ulong uVar11;
  uint uVar12;
  bool bVar13;
  string_view message;
  ActionMessage rxcmd;
  ActionMessage rep;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  undefined1 local_1a0 [184];
  undefined1 local_e8 [184];
  
  uVar6 = zmq_msg_size(msg);
  if (uVar6 < 0x19) {
    lVar7 = zmq_msg_data(msg);
    lVar8 = zmq_msg_size(msg);
    pcVar1 = local_1a0 + 0x10;
    local_1a0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,lVar7,lVar8 + lVar7);
    local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"close_server:","");
    pbVar9 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_1c0,(this->name_)._M_dataplus._M_p,(this->name_)._M_string_length);
    local_e8._0_8_ = (pbVar9->_M_dataplus)._M_p;
    paVar10 = &pbVar9->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._0_8_ == paVar10) {
      local_e8._16_8_ = paVar10->_M_allocated_capacity;
      local_e8._24_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
      local_e8._0_8_ = local_e8 + 0x10;
    }
    else {
      local_e8._16_8_ = paVar10->_M_allocated_capacity;
    }
    local_e8._8_8_ = pbVar9->_M_string_length;
    (pbVar9->_M_dataplus)._M_p = (pointer)paVar10;
    pbVar9->_M_string_length = 0;
    (pbVar9->field_2)._M_local_buf[0] = '\0';
    if (local_1a0._8_8_ == local_e8._8_8_) {
      if (local_1a0._8_8_ == 0) {
        bVar13 = true;
      }
      else {
        iVar5 = bcmp((void *)local_1a0._0_8_,(void *)local_e8._0_8_,local_1a0._8_8_);
        bVar13 = iVar5 == 0;
      }
    }
    else {
      bVar13 = false;
    }
    if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
      operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    if ((pointer)local_1a0._0_8_ != pcVar1) {
      operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
    }
    if (bVar13) {
      local_1a0._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"close_server:","");
      pbVar9 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::_M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1a0,(this->name_)._M_dataplus._M_p,(this->name_)._M_string_length);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar2 = (pbVar9->_M_dataplus)._M_p;
      paVar10 = &pbVar9->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 == paVar10) {
        uVar3 = *(undefined8 *)((long)&pbVar9->field_2 + 8);
        (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar10->_M_allocated_capacity;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar10->_M_allocated_capacity;
      }
      __return_storage_ptr__->_M_string_length = pbVar9->_M_string_length;
      (pbVar9->_M_dataplus)._M_p = (pointer)paVar10;
      pbVar9->_M_string_length = 0;
      (pbVar9->field_2)._M_local_buf[0] = '\0';
      if ((pointer)local_1a0._0_8_ == pcVar1) {
        return __return_storage_ptr__;
      }
      operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
      return __return_storage_ptr__;
    }
  }
  else {
    data = (void *)zmq_msg_data(msg);
    size = zmq_msg_size(msg);
    ActionMessage::ActionMessage((ActionMessage *)local_1a0,data,size);
    TypedBrokerServer::generateMessageResponse
              ((ActionMessage *)local_e8,(ActionMessage *)local_1a0,pdata,ctype);
    if (local_e8._0_4_ != cmd_ignore) {
      ActionMessage::to_string_abi_cxx11_
                ((string *)__return_storage_ptr__,(ActionMessage *)local_e8);
      ActionMessage::~ActionMessage((ActionMessage *)local_e8);
      ActionMessage::~ActionMessage((ActionMessage *)local_1a0);
      return __return_storage_ptr__;
    }
    ActionMessage::~ActionMessage((ActionMessage *)local_e8);
    ActionMessage::~ActionMessage((ActionMessage *)local_1a0);
  }
  uVar6 = zmq_msg_size(msg);
  uVar12 = 1;
  if (9 < uVar6) {
    uVar11 = uVar6;
    uVar4 = 4;
    do {
      uVar12 = uVar4;
      if (uVar11 < 100) {
        uVar12 = uVar12 - 2;
        goto LAB_001c41db;
      }
      if (uVar11 < 1000) {
        uVar12 = uVar12 - 1;
        goto LAB_001c41db;
      }
      if (uVar11 < 10000) goto LAB_001c41db;
      bVar13 = 99999 < uVar11;
      uVar11 = uVar11 / 10000;
      uVar4 = uVar12 + 4;
    } while (bVar13);
    uVar12 = uVar12 + 1;
  }
LAB_001c41db:
  local_e8._0_8_ = local_e8 + 0x10;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
             (ulong)uVar12,'\0');
  CLI::std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_e8._0_8_,local_e8._8_4_,uVar6)
  ;
  pbVar9 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,0,0
                   ,"received unknown message of length ",0x23);
  local_1a0._0_8_ = (pbVar9->_M_dataplus)._M_p;
  paVar10 = &pbVar9->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._0_8_ == paVar10) {
    local_1a0._16_8_ = paVar10->_M_allocated_capacity;
    local_1a0._24_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
    local_1a0._0_8_ = local_1a0 + 0x10;
  }
  else {
    local_1a0._16_8_ = paVar10->_M_allocated_capacity;
  }
  local_1a0._8_8_ = pbVar9->_M_string_length;
  (pbVar9->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar9->_M_string_length = 0;
  (pbVar9->field_2)._M_local_buf[0] = '\0';
  message._M_str = (char *)local_1a0._0_8_;
  message._M_len = local_1a0._8_8_;
  TypedBrokerServer::logMessage(message);
  if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
    operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
  }
  if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
    operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"ignored","");
  return __return_storage_ptr__;
}

Assistant:

std::string
    zmqBrokerServer::generateResponseToMessage(zmq::message_t& msg, portData& pdata, CoreType ctype)
{
    auto sz = msg.size();
    if (sz < 25) {
        if (std::string(static_cast<char*>(msg.data()), msg.size()) ==
            std::string("close_server:") + name_) {
            //      std::cerr << "received close server message" << std::endl;
            return std::string("close_server:") + name_;
        }
    } else {
        ActionMessage rxcmd(static_cast<char*>(msg.data()), msg.size());
        auto rep = generateMessageResponse(rxcmd, pdata, ctype);
        if (rep.action() != CMD_IGNORE) {
            return rep.to_string();
        }
    }
    logMessage("received unknown message of length " + std::to_string(msg.size()));
    return "ignored";
}